

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::TelemetryEventLogEntry_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  TelemetryEventLogEntry *into;
  
  into = GetInlineEventDataAs<TTD::NSLogEvents::TelemetryEventLogEntry,(TTD::NSLogEvents::EventKind)4>
                   (evt);
  FileReader::ReadString<TTD::SlabAllocatorBase<8>>(reader,stringVal,alloc,&into->InfoString,true);
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  into->DoPrint = SUB41(iVar1,0);
  return;
}

Assistant:

void TelemetryEventLogEntry_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            TelemetryEventLogEntry* telemetryEvt = GetInlineEventDataAs<TelemetryEventLogEntry, EventKind::TelemetryLogTag>(evt);

            reader->ReadString(NSTokens::Key::stringVal, alloc, telemetryEvt->InfoString, true);
            telemetryEvt->DoPrint = reader->ReadBool(NSTokens::Key::boolVal, true);
        }